

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

iterator __thiscall
llvm::SmallVectorImpl<std::__cxx11::string>::insert<llvm::StringRef_const*,void>
          (SmallVectorImpl<std::__cxx11::string> *this,iterator I,StringRef *From,StringRef *To)

{
  move_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  in_end;
  undefined8 *puVar1;
  undefined8 *puVar2;
  char *pcVar3;
  undefined8 uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__result;
  long lVar8;
  long lVar9;
  ulong uVar10;
  iterator pbVar11;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  pbVar11 = *(iterator *)this;
  lVar7 = (long)I - (long)pbVar11;
  uVar5 = (ulong)*(uint *)(this + 8);
  if (pbVar11 + uVar5 == I) {
    append<llvm::StringRef_const*,void>(this,From,To);
    __result = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (lVar7 + *(long *)this);
  }
  else {
    if (I < pbVar11) {
      __assert_fail("I >= this->begin() && \"Insertion iterator is out of bounds.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x259,
                    "iterator llvm::SmallVectorImpl<std::basic_string<char>>::insert(iterator, ItTy, ItTy) [T = std::basic_string<char>, ItTy = const llvm::StringRef *]"
                   );
    }
    if (pbVar11 + uVar5 < I) {
      __assert_fail("I <= this->end() && \"Inserting past the end of the vector.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x25a,
                    "iterator llvm::SmallVectorImpl<std::basic_string<char>>::insert(iterator, ItTy, ItTy) [T = std::basic_string<char>, ItTy = const llvm::StringRef *]"
                   );
    }
    uVar6 = (long)To - (long)From >> 4;
    if ((ulong)*(uint *)(this + 0xc) < uVar6 + uVar5) {
      SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      ::grow((SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              *)this,uVar6 + uVar5);
      pbVar11 = *(iterator *)this;
      uVar5 = (ulong)*(uint *)(this + 8);
    }
    __result = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)pbVar11 + lVar7);
    lVar9 = uVar5 * 0x20;
    in_end._M_current = pbVar11 + uVar5;
    uVar10 = lVar9 - lVar7 >> 5;
    if (uVar10 < uVar6) {
      uVar6 = uVar6 + uVar5;
      if (*(uint *)(this + 0xc) < uVar6) {
        __assert_fail("Size <= capacity()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                      ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
      }
      *(int *)(this + 8) = (int)uVar6;
      if (lVar9 != lVar7) {
        lVar8 = 0;
        do {
          pcVar3 = pbVar11[uVar6 - uVar10].field_2._M_local_buf + lVar8;
          puVar1 = (undefined8 *)((long)pbVar11 + lVar8 + lVar7 + 0x10);
          *(char **)((long)&pbVar11[uVar6 - uVar10]._M_dataplus._M_p + lVar8) = pcVar3;
          puVar2 = *(undefined8 **)((long)pbVar11 + lVar8 + lVar7);
          if (puVar1 == puVar2) {
            uVar4 = puVar1[1];
            *(undefined8 *)pcVar3 = *puVar1;
            *(undefined8 *)(pcVar3 + 8) = uVar4;
          }
          else {
            *(undefined8 **)(pcVar3 + -0x10) = puVar2;
            *(undefined8 *)pcVar3 = *puVar1;
          }
          *(undefined8 *)((long)&pbVar11[uVar6 - uVar10]._M_string_length + lVar8) =
               *(undefined8 *)((long)pbVar11 + lVar8 + lVar7 + 8);
          *(undefined8 **)((long)pbVar11 + lVar8 + lVar7) = puVar1;
          *(undefined8 *)((long)pbVar11 + lVar8 + lVar7 + 8) = 0;
          *(undefined1 *)((long)pbVar11 + lVar8 + lVar7 + 0x10) = 0;
          lVar8 = lVar8 + 0x20;
        } while (lVar9 - lVar7 != lVar8);
        if (lVar9 != lVar7) {
          this_00 = __result;
          do {
            pcVar3 = From->Data;
            local_50 = &local_40;
            if (pcVar3 == (char *)0x0) {
              local_48 = 0;
              local_40 = 0;
            }
            else {
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_50,pcVar3,pcVar3 + From->Length);
            }
            std::__cxx11::string::operator=((string *)this_00,(string *)&local_50);
            if (local_50 != &local_40) {
              operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
            }
            this_00 = this_00 + 1;
            From = From + 1;
            uVar10 = uVar10 - 1;
          } while (uVar10 != 0);
        }
      }
      std::__uninitialized_copy<false>::__uninit_copy<llvm::StringRef_const*,std::__cxx11::string*>
                (From,To,in_end._M_current);
    }
    else {
      append<std::move_iterator<std::__cxx11::string*>,void>(this,in_end._M_current + -uVar6,in_end)
      ;
      lVar7 = (long)(in_end._M_current + -uVar6) - (long)__result >> 5;
      if (0 < lVar7) {
        uVar10 = lVar7 + 1;
        pbVar11 = pbVar11 + uVar5;
        do {
          pbVar11 = pbVar11 + -1;
          std::__cxx11::string::operator=((string *)pbVar11,(string *)(pbVar11 + -uVar6));
          uVar10 = uVar10 - 1;
        } while (1 < uVar10);
      }
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<llvm::StringRef_const*,std::__cxx11::string*>(From,To,__result);
    }
  }
  return __result;
}

Assistant:

iterator insert(iterator I, ItTy From, ItTy To) {
    // Convert iterator to elt# to avoid invalidating iterator when we reserve()
    size_t InsertElt = I - this->begin();

    if (I == this->end()) {  // Important special case for empty vector.
      append(From, To);
      return this->begin()+InsertElt;
    }

    assert(I >= this->begin() && "Insertion iterator is out of bounds.");
    assert(I <= this->end() && "Inserting past the end of the vector.");

    size_t NumToInsert = std::distance(From, To);

    // Ensure there is enough space.
    reserve(this->size() + NumToInsert);

    // Uninvalidate the iterator.
    I = this->begin()+InsertElt;

    // If there are more elements between the insertion point and the end of the
    // range than there are being inserted, we can use a simple approach to
    // insertion.  Since we already reserved space, we know that this won't
    // reallocate the vector.
    if (size_t(this->end()-I) >= NumToInsert) {
      T *OldEnd = this->end();
      append(std::move_iterator<iterator>(this->end() - NumToInsert),
             std::move_iterator<iterator>(this->end()));

      // Copy the existing elements that get replaced.
      std::move_backward(I, OldEnd-NumToInsert, OldEnd);

      std::copy(From, To, I);
      return I;
    }

    // Otherwise, we're inserting more elements than exist already, and we're
    // not inserting at the end.

    // Move over the elements that we're about to overwrite.
    T *OldEnd = this->end();
    this->set_size(this->size() + NumToInsert);
    size_t NumOverwritten = OldEnd-I;
    this->uninitialized_move(I, OldEnd, this->end()-NumOverwritten);

    // Replace the overwritten part.
    for (T *J = I; NumOverwritten > 0; --NumOverwritten) {
      *J = *From;
      ++J; ++From;
    }

    // Insert the non-overwritten middle part.
    this->uninitialized_copy(From, To, OldEnd);
    return I;
  }